

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int incrVacuumStep(BtShared *pBt,Pgno nFin,Pgno iLastPg,int bCommit)

{
  MemPage *pMVar1;
  Pgno PVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int unaff_R12D;
  bool bVar8;
  u8 eType;
  MemPage *pFreePg;
  Pgno iFreePg_1;
  Pgno iPtrPage;
  Pgno iFreePg;
  byte local_61;
  MemPage *local_60;
  uint local_54;
  Pgno local_50;
  uint local_4c;
  uint local_48;
  Pgno local_44;
  MemPage *local_40;
  MemPage *local_38;
  
  PVar2 = 0;
  if (1 < iLastPg) {
    iVar6 = (iLastPg - 2) - (iLastPg - 2) % (pBt->usableSize / 5 + 1);
    PVar2 = iVar6 + (uint)(iVar6 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
  }
  if ((PVar2 == iLastPg) || ((uint)sqlite3PendingByte / pBt->pageSize + 1 == iLastPg))
  goto LAB_00207d79;
  uVar3 = *(uint *)(pBt->pPage1->aData + 0x24);
  if (((uVar3 >> 0x18 == 0 && (uVar3 & 0xff0000) == 0) && (uVar3 & 0xff00) == 0) &&
      (uVar3 & 0xff) == 0) {
    iVar6 = 0x65;
LAB_00207d71:
    bVar8 = false;
  }
  else {
    iVar6 = ptrmapGet(pBt,iLastPg,&local_61,&local_44);
    if (iVar6 != 0) goto LAB_00207d71;
    if (local_61 == 2) {
      bVar8 = true;
      iVar6 = unaff_R12D;
      if (bCommit == 0) {
        iVar6 = allocateBtreePage(pBt,&local_60,(Pgno *)&local_40,iLastPg,'\x01');
        if (iVar6 != 0) goto LAB_00207d71;
        if (local_60 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_60->pDbPage);
        }
      }
    }
    else if (local_61 == 1) {
      bVar8 = false;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf6b7,
                  "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
      iVar6 = 0xb;
    }
    else {
      local_54 = (uint)local_61;
      bVar8 = false;
      iVar6 = btreeGetPage(pBt,iLastPg,&local_60,0);
      if (iVar6 == 0) {
        local_50 = 0;
        if (bCommit == 0) {
          local_50 = nFin;
        }
        local_38 = local_60;
        local_4c = (uint)(byte)((bCommit == 0) * '\x02');
        iVar6 = unaff_R12D;
        do {
          iVar5 = allocateBtreePage(pBt,&local_40,&local_48,local_50,(u8)local_4c);
          pMVar1 = local_40;
          if (iVar5 != 0) {
            pMVar1 = local_38;
            iVar6 = iVar5;
          }
          if (pMVar1 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar1->pDbPage);
          }
          if (iVar5 != 0) goto LAB_00207d71;
        } while ((bCommit != 0) && (nFin < local_48));
        iVar5 = relocatePage(pBt,local_60,(u8)local_54,local_44,local_48,bCommit);
        if (local_60 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_60->pDbPage);
        }
        bVar8 = iVar5 == 0;
        if (!bVar8) {
          iVar6 = iVar5;
        }
      }
    }
  }
  if (!bVar8) {
    return iVar6;
  }
LAB_00207d79:
  if (bCommit != 0) {
    return 0;
  }
  uVar3 = (uint)sqlite3PendingByte / pBt->pageSize;
  uVar7 = iLastPg - 1;
  do {
    if ((-2 - uVar3) + uVar7 != -1) {
      uVar4 = 0;
      if (1 < uVar7) {
        iVar6 = (uVar7 - 2) - (uVar7 - 2) % (pBt->usableSize / 5 + 1);
        uVar4 = iVar6 + (uint)(iVar6 + 1U == uVar3) + 2;
      }
      if (uVar7 != uVar4) {
        pBt->bDoTruncate = '\x01';
        pBt->nPage = uVar7;
        return 0;
      }
    }
    uVar7 = uVar7 - 1;
  } while( true );
}

Assistant:

static int incrVacuumStep(BtShared *pBt, Pgno nFin, Pgno iLastPg, int bCommit){
  Pgno nFreeList;           /* Number of pages still on the free-list */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( iLastPg>nFin );

  if( !PTRMAP_ISPAGE(pBt, iLastPg) && iLastPg!=PENDING_BYTE_PAGE(pBt) ){
    u8 eType;
    Pgno iPtrPage;

    nFreeList = get4byte(&pBt->pPage1->aData[36]);
    if( nFreeList==0 ){
      return SQLITE_DONE;
    }

    rc = ptrmapGet(pBt, iLastPg, &eType, &iPtrPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( eType==PTRMAP_ROOTPAGE ){
      return SQLITE_CORRUPT_BKPT;
    }

    if( eType==PTRMAP_FREEPAGE ){
      if( bCommit==0 ){
        /* Remove the page from the files free-list. This is not required
        ** if bCommit is non-zero. In that case, the free-list will be
        ** truncated to zero after this function returns, so it doesn't 
        ** matter if it still contains some garbage entries.
        */
        Pgno iFreePg;
        MemPage *pFreePg;
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iLastPg, BTALLOC_EXACT);
        if( rc!=SQLITE_OK ){
          return rc;
        }
        assert( iFreePg==iLastPg );
        releasePage(pFreePg);
      }
    } else {
      Pgno iFreePg;             /* Index of free page to move pLastPg to */
      MemPage *pLastPg;
      u8 eMode = BTALLOC_ANY;   /* Mode parameter for allocateBtreePage() */
      Pgno iNear = 0;           /* nearby parameter for allocateBtreePage() */

      rc = btreeGetPage(pBt, iLastPg, &pLastPg, 0);
      if( rc!=SQLITE_OK ){
        return rc;
      }

      /* If bCommit is zero, this loop runs exactly once and page pLastPg
      ** is swapped with the first free page pulled off the free list.
      **
      ** On the other hand, if bCommit is greater than zero, then keep
      ** looping until a free-page located within the first nFin pages
      ** of the file is found.
      */
      if( bCommit==0 ){
        eMode = BTALLOC_LE;
        iNear = nFin;
      }
      do {
        MemPage *pFreePg;
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iNear, eMode);
        if( rc!=SQLITE_OK ){
          releasePage(pLastPg);
          return rc;
        }
        releasePage(pFreePg);
      }while( bCommit && iFreePg>nFin );
      assert( iFreePg<iLastPg );
      
      rc = relocatePage(pBt, pLastPg, eType, iPtrPage, iFreePg, bCommit);
      releasePage(pLastPg);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  if( bCommit==0 ){
    do {
      iLastPg--;
    }while( iLastPg==PENDING_BYTE_PAGE(pBt) || PTRMAP_ISPAGE(pBt, iLastPg) );
    pBt->bDoTruncate = 1;
    pBt->nPage = iLastPg;
  }
  return SQLITE_OK;
}